

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_compressSubBlock_literal
                 (HUF_CElt *hufTable,ZSTD_hufCTablesMetadata_t *hufMetadata,BYTE *literals,
                 size_t litSize,void *dst,size_t dstSize,int bmi2,int writeEntropy,
                 int *entropyWritten)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  void *src;
  long lVar4;
  ulong uVar5;
  ulong in_RCX;
  int *in_RSI;
  long in_R8;
  int in_stack_00000010;
  undefined4 *in_stack_00000018;
  U32 lhc_2;
  U32 lhc_1;
  U32 lhc;
  size_t cSize;
  int flags;
  size_t cLitSize;
  symbolEncodingType_e hType;
  U32 singleStream;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  size_t lhSize;
  size_t header;
  U32 in_stack_ffffffffffffff5c;
  HUF_CElt *in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  void *in_stack_ffffffffffffff80;
  long local_70;
  void *local_60;
  size_t local_8;
  
  iVar1 = 0;
  if (in_stack_00000010 != 0) {
    iVar1 = 200;
  }
  uVar3 = (ulong)(int)((0x400U - (long)iVar1 <= in_RCX) + 3 +
                      (uint)(0x4000U - (long)iVar1 <= in_RCX));
  local_60 = (void *)(in_R8 + uVar3);
  if (in_stack_00000010 == 0) {
    iVar1 = 3;
  }
  else {
    iVar1 = *in_RSI;
  }
  local_70 = 0;
  *in_stack_00000018 = 0;
  if ((in_RCX == 0) || (*in_RSI == 0)) {
    local_8 = ZSTD_noCompressLiterals
                        ((void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         CONCAT44(in_stack_ffffffffffffff74,iVar1),in_stack_ffffffffffffff68,
                         (size_t)in_stack_ffffffffffffff60);
  }
  else if (*in_RSI == 1) {
    local_8 = ZSTD_compressRleLiteralsBlock
                        (in_stack_ffffffffffffff80,
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         (void *)CONCAT44(in_stack_ffffffffffffff74,iVar1),
                         (size_t)in_stack_ffffffffffffff68);
  }
  else {
    if ((in_stack_00000010 != 0) && (*in_RSI == 2)) {
      memcpy(local_60,in_RSI + 1,*(size_t *)(in_RSI + 0x22));
      local_60 = (void *)(*(long *)(in_RSI + 0x22) + (long)local_60);
      local_70 = *(long *)(in_RSI + 0x22);
    }
    if (uVar3 == 3) {
      src = (void *)HUF_compress1X_usingCTable
                              (in_stack_ffffffffffffff80,
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                               (void *)CONCAT44(in_stack_ffffffffffffff74,iVar1),
                               (size_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                               in_stack_ffffffffffffff5c);
    }
    else {
      src = (void *)HUF_compress4X_usingCTable
                              (in_stack_ffffffffffffff80,
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                               (void *)CONCAT44(in_stack_ffffffffffffff74,iVar1),
                               (size_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                               in_stack_ffffffffffffff5c);
    }
    lVar4 = (long)src + (long)local_60;
    uVar5 = (long)src + local_70;
    if ((src == (void *)0x0) || (uVar2 = ERR_isError((size_t)src), uVar2 != 0)) {
      local_8 = 0;
    }
    else if ((in_stack_00000010 == 0) && (in_RCX <= uVar5)) {
      local_8 = ZSTD_noCompressLiterals
                          ((void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           CONCAT44(in_stack_ffffffffffffff74,iVar1),src,
                           (size_t)in_stack_ffffffffffffff60);
    }
    else if (uVar3 < (ulong)(long)(int)((0x3ff < uVar5) + 3 + (uint)(0x3fff < uVar5))) {
      local_8 = ZSTD_noCompressLiterals
                          ((void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           CONCAT44(in_stack_ffffffffffffff74,iVar1),src,
                           (size_t)in_stack_ffffffffffffff60);
    }
    else {
      if (uVar3 == 3) {
        MEM_writeLE24((void *)0x3,in_stack_ffffffffffffff5c);
      }
      else if (uVar3 == 4) {
        MEM_writeLE32((void *)0x4,in_stack_ffffffffffffff5c);
      }
      else if (uVar3 == 5) {
        MEM_writeLE32((void *)0x5,in_stack_ffffffffffffff5c);
        *(char *)(in_R8 + 4) = (char)(uVar5 >> 10);
      }
      *in_stack_00000018 = 1;
      local_8 = lVar4 - in_R8;
    }
  }
  return local_8;
}

Assistant:

static size_t
ZSTD_compressSubBlock_literal(const HUF_CElt* hufTable,
                              const ZSTD_hufCTablesMetadata_t* hufMetadata,
                              const BYTE* literals, size_t litSize,
                              void* dst, size_t dstSize,
                              const int bmi2, int writeEntropy, int* entropyWritten)
{
    size_t const header = writeEntropy ? 200 : 0;
    size_t const lhSize = 3 + (litSize >= (1 KB - header)) + (litSize >= (16 KB - header));
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart + lhSize;
    U32 const singleStream = lhSize == 3;
    symbolEncodingType_e hType = writeEntropy ? hufMetadata->hType : set_repeat;
    size_t cLitSize = 0;

    DEBUGLOG(5, "ZSTD_compressSubBlock_literal (litSize=%zu, lhSize=%zu, writeEntropy=%d)", litSize, lhSize, writeEntropy);

    *entropyWritten = 0;
    if (litSize == 0 || hufMetadata->hType == set_basic) {
      DEBUGLOG(5, "ZSTD_compressSubBlock_literal using raw literal");
      return ZSTD_noCompressLiterals(dst, dstSize, literals, litSize);
    } else if (hufMetadata->hType == set_rle) {
      DEBUGLOG(5, "ZSTD_compressSubBlock_literal using rle literal");
      return ZSTD_compressRleLiteralsBlock(dst, dstSize, literals, litSize);
    }

    assert(litSize > 0);
    assert(hufMetadata->hType == set_compressed || hufMetadata->hType == set_repeat);

    if (writeEntropy && hufMetadata->hType == set_compressed) {
        ZSTD_memcpy(op, hufMetadata->hufDesBuffer, hufMetadata->hufDesSize);
        op += hufMetadata->hufDesSize;
        cLitSize += hufMetadata->hufDesSize;
        DEBUGLOG(5, "ZSTD_compressSubBlock_literal (hSize=%zu)", hufMetadata->hufDesSize);
    }

    {   int const flags = bmi2 ? HUF_flags_bmi2 : 0;
        const size_t cSize = singleStream ? HUF_compress1X_usingCTable(op, (size_t)(oend-op), literals, litSize, hufTable, flags)
                                          : HUF_compress4X_usingCTable(op, (size_t)(oend-op), literals, litSize, hufTable, flags);
        op += cSize;
        cLitSize += cSize;
        if (cSize == 0 || ERR_isError(cSize)) {
            DEBUGLOG(5, "Failed to write entropy tables %s", ZSTD_getErrorName(cSize));
            return 0;
        }
        /* If we expand and we aren't writing a header then emit uncompressed */
        if (!writeEntropy && cLitSize >= litSize) {
            DEBUGLOG(5, "ZSTD_compressSubBlock_literal using raw literal because uncompressible");
            return ZSTD_noCompressLiterals(dst, dstSize, literals, litSize);
        }
        /* If we are writing headers then allow expansion that doesn't change our header size. */
        if (lhSize < (size_t)(3 + (cLitSize >= 1 KB) + (cLitSize >= 16 KB))) {
            assert(cLitSize > litSize);
            DEBUGLOG(5, "Literals expanded beyond allowed header size");
            return ZSTD_noCompressLiterals(dst, dstSize, literals, litSize);
        }
        DEBUGLOG(5, "ZSTD_compressSubBlock_literal (cSize=%zu)", cSize);
    }

    /* Build header */
    switch(lhSize)
    {
    case 3: /* 2 - 2 - 10 - 10 */
        {   U32 const lhc = hType + ((U32)(!singleStream) << 2) + ((U32)litSize<<4) + ((U32)cLitSize<<14);
            MEM_writeLE24(ostart, lhc);
            break;
        }
    case 4: /* 2 - 2 - 14 - 14 */
        {   U32 const lhc = hType + (2 << 2) + ((U32)litSize<<4) + ((U32)cLitSize<<18);
            MEM_writeLE32(ostart, lhc);
            break;
        }
    case 5: /* 2 - 2 - 18 - 18 */
        {   U32 const lhc = hType + (3 << 2) + ((U32)litSize<<4) + ((U32)cLitSize<<22);
            MEM_writeLE32(ostart, lhc);
            ostart[4] = (BYTE)(cLitSize >> 10);
            break;
        }
    default:  /* not possible : lhSize is {3,4,5} */
        assert(0);
    }
    *entropyWritten = 1;
    DEBUGLOG(5, "Compressed literals: %u -> %u", (U32)litSize, (U32)(op-ostart));
    return (size_t)(op-ostart);
}